

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockFailureTest_MockUnexpectedInputParameterFailure_TestShell::createTest
          (TEST_MockFailureTest_MockUnexpectedInputParameterFailure_TestShell *this)

{
  TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test *this_00;
  TEST_MockFailureTest_MockUnexpectedInputParameterFailure_TestShell *this_local;
  
  this_00 = (TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
                         ,0x9d);
  TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test::
  TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedInputParameterFailure)
{
    call1->withName("foo").withParameter("boo", 2);
    call2->withName("foo").withParameter("boo", 3.3);
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue(2);

    MockUnexpectedInputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> int boo: <2 (0x2)> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> double boo: <3.3> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected parameter passed to function: foo\n"
                 "\t\tint bar: <2 (0x2)>", failure.getMessage().asCharString());
}